

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 FastJsonDecode(void *pIn,sxu32 nByte,jx9_value *pOut,uchar **pzPtr,int iNest)

{
  jx9_hashmap *pjVar1;
  bool bVar2;
  jx9_hashmap *pMap_1;
  jx9_value sKey;
  jx9_value sVal_1;
  jx9_value sVal;
  jx9_hashmap *pMap;
  sxu32 iLength;
  sxu16 iLen;
  double iVal_1;
  sxu64 iVal;
  int c;
  sxi32 rc;
  uchar *zEnd;
  uchar *zIn;
  uchar **ppuStack_30;
  int iNest_local;
  uchar **pzPtr_local;
  jx9_value *pOut_local;
  void *pvStack_18;
  sxu32 nByte_local;
  void *pIn_local;
  
  _c = (uchar *)((long)pIn + (ulong)nByte);
  iVal._4_4_ = 0;
  if (iNest < 0x40) {
    iVal._0_4_ = (uint)*pIn;
    zEnd = (uchar *)((long)pIn + 1);
    zIn._4_4_ = iNest;
    ppuStack_30 = pzPtr;
    pzPtr_local = (uchar **)pOut;
    pOut_local._4_4_ = nByte;
    pvStack_18 = pIn;
    switch((uint)iVal) {
    case 1:
      pjVar1 = jx9NewHashmap(pOut->pVm,(_func_sxu32_sxi64 *)0x0,(_func_sxu32_void_ptr_sxu32 *)0x0);
      if (pjVar1 == (jx9_hashmap *)0x0) {
        iVal._4_4_ = -1;
      }
      else {
        jx9MemObjInit((jx9_vm *)pzPtr_local[2],(jx9_value *)&sKey.nIdx);
        jx9MemObjInit((jx9_vm *)pzPtr_local[2],(jx9_value *)&pMap_1);
        jx9MemObjRelease((jx9_value *)pzPtr_local);
        *(uint *)(pzPtr_local + 1) = *(uint *)(pzPtr_local + 1) & 0xfffffe90 | 0x40;
        *pzPtr_local = (uchar *)pjVar1;
        iVal._4_4_ = 0;
        while( true ) {
          while( true ) {
            bVar2 = false;
            if (zEnd < _c) {
              bVar2 = *zEnd == '\x06';
            }
            if (!bVar2) break;
            zEnd = zEnd + 1;
          }
          if ((_c <= zEnd) || (*zEnd == '\x02')) break;
          iVal._4_4_ = FastJsonDecode(zEnd,(int)_c - (int)zEnd,(jx9_value *)&pMap_1,&zEnd,
                                      zIn._4_4_ + 1);
          if (iVal._4_4_ != 0) goto LAB_00124a96;
          if ((_c <= zEnd) || (*zEnd != '\x05')) {
            iVal._4_4_ = -0x18;
            goto LAB_00124a96;
          }
          zEnd = zEnd + 1;
          if (_c <= zEnd) {
            iVal._4_4_ = -0x18;
            goto LAB_00124a96;
          }
          iVal._4_4_ = FastJsonDecode(zEnd,(int)_c - (int)zEnd,(jx9_value *)&sKey.nIdx,&zEnd,
                                      zIn._4_4_ + 1);
          if ((iVal._4_4_ != 0) ||
             (iVal._4_4_ = jx9HashmapInsert(pjVar1,(jx9_value *)&pMap_1,(jx9_value *)&sKey.nIdx),
             iVal._4_4_ != 0)) goto LAB_00124a96;
        }
        if (zEnd < _c) {
          zEnd = zEnd + 1;
        }
LAB_00124a96:
        if (iVal._4_4_ != 0) {
          jx9MemObjRelease((jx9_value *)pzPtr_local);
        }
        jx9MemObjRelease((jx9_value *)&sKey.nIdx);
        jx9MemObjRelease((jx9_value *)&pMap_1);
      }
      break;
    default:
      iVal._4_4_ = -0x18;
      break;
    case 3:
      pjVar1 = jx9NewHashmap(pOut->pVm,(_func_sxu32_sxi64 *)0x0,(_func_sxu32_void_ptr_sxu32 *)0x0);
      if (pjVar1 == (jx9_hashmap *)0x0) {
        iVal._4_4_ = -1;
      }
      else {
        jx9MemObjInit((jx9_vm *)pzPtr_local[2],(jx9_value *)&sVal_1.nIdx);
        jx9MemObjRelease((jx9_value *)pzPtr_local);
        *(uint *)(pzPtr_local + 1) = *(uint *)(pzPtr_local + 1) & 0xfffffe90 | 0x40;
        *pzPtr_local = (uchar *)pjVar1;
        iVal._4_4_ = 0;
        while( true ) {
          while( true ) {
            bVar2 = false;
            if (zEnd < _c) {
              bVar2 = *zEnd == '\x06';
            }
            if (!bVar2) break;
            zEnd = zEnd + 1;
          }
          if ((_c <= zEnd) || (*zEnd == '\x04')) break;
          iVal._4_4_ = FastJsonDecode(zEnd,(int)_c - (int)zEnd,(jx9_value *)&sVal_1.nIdx,&zEnd,
                                      zIn._4_4_ + 1);
          if ((iVal._4_4_ != 0) ||
             (iVal._4_4_ = jx9HashmapInsert(pjVar1,(jx9_value *)0x0,(jx9_value *)&sVal_1.nIdx),
             iVal._4_4_ != 0)) goto LAB_001248a3;
        }
        if (zEnd < _c) {
          zEnd = zEnd + 1;
        }
LAB_001248a3:
        if (iVal._4_4_ != 0) {
          jx9MemObjRelease((jx9_value *)pzPtr_local);
        }
        jx9MemObjRelease((jx9_value *)&sVal_1.nIdx);
      }
      break;
    case 8:
      if ((uchar *)((long)pIn + 5U) < _c) {
        SyBigEndianUnpack32(zEnd,(sxu32 *)&pMap);
        if (zEnd + (uint)pMap < _c) {
          zEnd = zEnd + 4;
          if (((ulong)pzPtr_local[1] & 1) != 0) {
            SyBlobReset((SyBlob *)(pzPtr_local + 3));
          }
          iVal._4_4_ = jx9MemObjStringAppend((jx9_value *)pzPtr_local,(char *)zEnd,(uint)pMap);
          zEnd = zEnd + (uint)pMap;
        }
        else {
          iVal._4_4_ = -0x18;
        }
      }
      else {
        iVal._4_4_ = -0x18;
      }
      break;
    case 10:
      if ((uchar *)((long)pIn + 9U) < _c) {
        SyBigEndianUnpack64(zEnd,(sxu64 *)&iVal_1);
        zEnd = zEnd + 8;
        jx9_value_int64((jx9_value *)pzPtr_local,(jx9_int64)iVal_1);
      }
      else {
        iVal._4_4_ = -0x18;
      }
      break;
    case 0x12:
      _iLength = 0.0;
      if ((uchar *)((long)pIn + 3U) < _c) {
        SyBigEndianUnpack16(zEnd,(sxu16 *)((long)&pMap + 6));
        if (zEnd + pMap._6_2_ < _c) {
          zEnd = zEnd + 2;
          SyStrToReal((char *)zEnd,(uint)pMap._6_2_,&iLength,(char **)0x0);
          zEnd = zEnd + (int)(uint)pMap._6_2_;
          jx9_value_double((jx9_value *)pzPtr_local,_iLength);
        }
        else {
          iVal._4_4_ = -0x18;
        }
      }
      else {
        iVal._4_4_ = -0x18;
      }
      break;
    case 0x17:
      jx9_value_null(pOut);
      break;
    case 0x18:
      jx9_value_bool(pOut,1);
      break;
    case 0x19:
      jx9_value_bool(pOut,0);
    }
    if (ppuStack_30 != (uchar **)0x0) {
      *ppuStack_30 = zEnd;
    }
    pIn_local._4_4_ = iVal._4_4_;
  }
  else {
    pIn_local._4_4_ = -7;
  }
  return pIn_local._4_4_;
}

Assistant:

UNQLITE_PRIVATE sxi32 FastJsonDecode(
	const void *pIn,  /* Binary JSON  */
	sxu32 nByte,      /* Chunk delimiter */
	jx9_value *pOut,  /* Decoded value */
	const unsigned char **pzPtr,
	int iNest /* Nesting limit */
	)
{
	const unsigned char *zIn = (const unsigned char *)pIn;
	const unsigned char *zEnd = &zIn[nByte];
	sxi32 rc = SXRET_OK;
	int c;
	if( iNest >= UNQLITE_FAST_JSON_NEST_LIMIT ){
		/* Nesting limit reached */
		return SXERR_LIMIT;
	}
	c = zIn[0];
	/* Advance the stream cursor */
	zIn++;
	/* Process the binary token */
	switch(c){
	case FJSON_NULL:
		/* null */
		jx9_value_null(pOut);
		break;
	case FJSON_FALSE:
		/* Boolean FALSE */
		jx9_value_bool(pOut,0);
		break;
	case FJSON_TRUE:
		/* Boolean TRUE */
		jx9_value_bool(pOut,1);
		break;
	case FJSON_INT64: {
		/* 64Bit integer */
		sxu64 iVal;
		/* Sanity check */
		if( &zIn[8] >= zEnd ){
			/* Corrupt chunk */
			rc = SXERR_CORRUPT;
			break;
		}
		SyBigEndianUnpack64(zIn,&iVal);
		/* Advance the pointer */
		zIn += 8;
		jx9_value_int64(pOut,(jx9_int64)iVal);
		break;
					  }
	case FJSON_REAL: {
		/* Real number */
		double iVal = 0; /* cc warning */
		sxu16 iLen;
		/* Sanity check */
		if( &zIn[2] >= zEnd ){
			/* Corrupt chunk */
			rc = SXERR_CORRUPT;
			break;
		}
		SyBigEndianUnpack16(zIn,&iLen);
		if( &zIn[iLen] >= zEnd ){
			/* Corrupt chunk */
			rc = SXERR_CORRUPT;
			break;
		}
		zIn += 2;
		SyStrToReal((const char *)zIn,(sxu32)iLen,&iVal,0);
		/* Advance the pointer */
		zIn += iLen;
		jx9_value_double(pOut,iVal);
		break;
					 }
	case FJSON_STRING: {
		/* UTF-8/Binary chunk */
		sxu32 iLength;
		/* Sanity check */
		if( &zIn[4] >= zEnd ){
			/* Corrupt chunk */
			rc = SXERR_CORRUPT;
			break;
		}
		SyBigEndianUnpack32(zIn,&iLength);
		if( &zIn[iLength] >= zEnd ){
			/* Corrupt chunk */
			rc = SXERR_CORRUPT;
			break;
		}
		zIn += 4;
		/* Invalidate any prior representation */
		if( pOut->iFlags & MEMOBJ_STRING ){
			/* Reset the string cursor */
			SyBlobReset(&pOut->sBlob);
		}
		rc = jx9MemObjStringAppend(pOut,(const char *)zIn,iLength);
		/* Update pointer */
		zIn += iLength;
		break;
					   }
	case FJSON_ARRAY_START: {
		/* Binary JSON array */
		jx9_hashmap *pMap;
		jx9_value sVal;
		/* Allocate a new hashmap */
		pMap = (jx9_hashmap *)jx9NewHashmap(pOut->pVm,0,0);
		if( pMap == 0 ){
			rc = SXERR_MEM;
			break;
		}
		jx9MemObjInit(pOut->pVm,&sVal);
		jx9MemObjRelease(pOut);
		MemObjSetType(pOut,MEMOBJ_HASHMAP);
		pOut->x.pOther = pMap;
		rc = SXRET_OK;
		for(;;){
			/* Jump leading binary commas */
			while (zIn < zEnd && zIn[0] == FJSON_COMMA ){
				zIn++;
			}
			if( zIn >= zEnd || zIn[0] == FJSON_ARRAY_END ){
				if( zIn < zEnd ){
					zIn++; /* Jump the trailing binary ] */
				}
				break;
			}
			/* Decode the value */
			rc = FastJsonDecode((const void *)zIn,(sxu32)(zEnd-zIn),&sVal,&zIn,iNest+1);
			if( rc != SXRET_OK ){
				break;
			}
			/* Insert the decoded value */
			rc = jx9HashmapInsert(pMap,0,&sVal);
			if( rc != UNQLITE_OK ){
				break;
			}
		}
		if( rc != SXRET_OK ){
			jx9MemObjRelease(pOut);
		}
		jx9MemObjRelease(&sVal);
		break;
							}
	case FJSON_DOC_START: {
		/* Binary JSON object */
		jx9_value sVal,sKey;
		jx9_hashmap *pMap;
		/* Allocate a new hashmap */
		pMap = (jx9_hashmap *)jx9NewHashmap(pOut->pVm,0,0);
		if( pMap == 0 ){
			rc = SXERR_MEM;
			break;
		}
		jx9MemObjInit(pOut->pVm,&sVal);
		jx9MemObjInit(pOut->pVm,&sKey);
		jx9MemObjRelease(pOut);
		MemObjSetType(pOut,MEMOBJ_HASHMAP);
		pOut->x.pOther = pMap;
		rc = SXRET_OK;
		for(;;){
			/* Jump leading binary commas */
			while (zIn < zEnd && zIn[0] == FJSON_COMMA ){
				zIn++;
			}
			if( zIn >= zEnd || zIn[0] == FJSON_DOC_END ){
				if( zIn < zEnd ){
					zIn++; /* Jump the trailing binary } */
				}
				break;
			}
			/* Extract the key */
			rc = FastJsonDecode((const void *)zIn,(sxu32)(zEnd-zIn),&sKey,&zIn,iNest+1);
			if( rc != UNQLITE_OK ){
				break;
			}
			if( zIn >= zEnd || zIn[0] != FJSON_COLON ){
				rc = UNQLITE_CORRUPT;
				break;
			}
			zIn++; /* Jump the binary colon ':' */
			if( zIn >= zEnd ){
				rc = UNQLITE_CORRUPT;
				break;
			}
			/* Decode the value */
			rc = FastJsonDecode((const void *)zIn,(sxu32)(zEnd-zIn),&sVal,&zIn,iNest+1);
			if( rc != SXRET_OK ){
				break;
			}
			/* Insert the key and its associated value */
			rc = jx9HashmapInsert(pMap,&sKey,&sVal);
			if( rc != UNQLITE_OK ){
				break;
			}
		}
		if( rc != SXRET_OK ){
			jx9MemObjRelease(pOut);
		}
		jx9MemObjRelease(&sVal);
		jx9MemObjRelease(&sKey);
		break;
						  }
	default:
		/* Corrupt data */
		rc = SXERR_CORRUPT;
		break;
	}
	if( pzPtr ){
		*pzPtr = zIn;
	}
	return rc;
}